

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward.c
# Opt level: O0

int32 forward(float64 **active_alpha,uint32 **active_astate,uint32 *n_active_astate,uint32 **bp,
             float64 *scale,float64 **dscale,vector_t **feature,uint32 n_obs,state_t *state_seq,
             uint32 n_state,model_inventory_t *inv,float64 beam,s3phseg_t *phseg,bw_timers_t *timers
             ,uint32 mmi_train)

{
  double *pdVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32 uVar7;
  gauden_t *g_00;
  acmod_set_t *acmod_set;
  float32 ***pppfVar8;
  float32 *pfVar9;
  acmod_id_t aVar10;
  acmod_id_t aVar11;
  void *ptr;
  float64 ***den;
  uint32 ***den_idx;
  double *ptr_00;
  undefined4 *ptr_01;
  void *ptr_02;
  uint32 *cb;
  void *ptr_03;
  float64 *pfVar12;
  uint32 *puVar13;
  uint32 *puVar14;
  uint uVar15;
  bool bVar16;
  float64 fVar17;
  double dVar18;
  double dVar19;
  uint32 **local_150;
  void *local_120;
  float64 *best_pred;
  int can_prune_phseg;
  float64 *outprob;
  int32 *acbframe;
  uint32 n_l_cb;
  uint32 retval;
  uint32 ***now_den_idx;
  float64 ***now_den;
  float64 balpha;
  float64 pthresh;
  float64 x;
  acmod_set_t *as;
  gauden_t *g;
  float32 ***mixw;
  float64 prior_alpha;
  float32 *tprob;
  uint32 *next;
  uint16 *amap;
  uint32 aalpha_alloc;
  uint32 n_next_active;
  uint32 *next_active;
  uint32 local_80;
  uint32 n_sum_active;
  uint32 n_active_l_cb;
  uint32 n_active;
  uint32 *active_l_cb;
  uint32 *active;
  uint32 *active_b;
  uint32 *active_a;
  uint32 l_cb;
  uint32 u;
  uint32 t;
  uint32 s;
  uint32 j;
  uint32 i;
  float64 beam_local;
  float64 **dscale_local;
  float64 *scale_local;
  uint32 **bp_local;
  uint32 *n_active_astate_local;
  uint32 **active_astate_local;
  float64 **active_alpha_local;
  
  acbframe._4_4_ = 0;
  local_120 = (void *)0x0;
  uVar3 = inv->n_cb_inverse;
  ptr = __ckd_calloc__((ulong)uVar3,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                       ,0xe8);
  g_00 = inv->gauden;
  acmod_set = inv->mdef->acmod_set;
  den = (float64 ***)
        __ckd_calloc_3d__((ulong)uVar3,(ulong)g_00->n_feat,(ulong)g_00->n_top,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xee);
  den_idx = (uint32 ***)
            __ckd_calloc_3d__((ulong)uVar3,(ulong)g_00->n_feat,(ulong)g_00->n_top,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                              ,0xf0);
  pppfVar8 = inv->mixw;
  ptr_00 = (double *)
           __ckd_calloc__((ulong)n_state,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xf5);
  ptr_01 = (undefined4 *)
           __ckd_calloc__((ulong)n_state,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xf8);
  ptr_02 = __ckd_calloc__((ulong)n_state,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xf9);
  cb = (uint32 *)
       __ckd_calloc__((ulong)n_state,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                      ,0xfc);
  ptr_03 = __ckd_calloc__((ulong)n_state,2,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0x100);
  next_active._4_4_ = 0;
  for (s = 0; s < n_state; s = s + 1) {
    *(undefined2 *)((long)ptr_03 + (ulong)s * 2) = 0xffff;
  }
  if (timers != (bw_timers_t *)0x0) {
    ptmr_start(&timers->gau_timer);
  }
  gauden_compute_log(den[state_seq->l_cb],den_idx[state_seq->l_cb],*feature,g_00,state_seq->cb,
                     (uint32 **)0x0);
  *cb = state_seq->l_cb;
  pfVar12 = gauden_scale_densities_fwd(den,den_idx,cb,1,g_00);
  *dscale = pfVar12;
  fVar17 = gauden_mixture(den[state_seq->l_cb],den_idx[state_seq->l_cb],pppfVar8[state_seq->mixw],
                          g_00);
  *ptr_00 = (double)fVar17;
  if (timers != (bw_timers_t *)0x0) {
    ptmr_stop(&timers->gau_timer);
  }
  if (*ptr_00 <= 1.199999978106707e-38) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
            ,300,"Small output prob (== %.2e) seen at frame 0 state 0\n",*ptr_00);
    acbframe._4_4_ = -1;
LAB_00109e4d:
    ckd_free(ptr_01);
    ckd_free(ptr_02);
    ckd_free(ptr_03);
    ckd_free(cb);
    ckd_free(ptr);
    ckd_free(ptr_00);
    ckd_free(local_120);
    ckd_free_3d(den);
    ckd_free_3d(den_idx);
    return acbframe._4_4_;
  }
  pfVar12 = (float64 *)
            __ckd_calloc__(1,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                           ,0x137);
  *active_alpha = pfVar12;
  puVar13 = (uint32 *)
            __ckd_calloc__(1,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                           ,0x138);
  *active_astate = puVar13;
  if (bp != (uint32 **)0x0) {
    puVar13 = (uint32 *)
              __ckd_calloc__(1,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                             ,0x13a);
    *bp = puVar13;
  }
  amap._0_4_ = 1;
  if (bp != (uint32 **)0x0) {
    local_120 = __ckd_calloc__(1,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                               ,0x141);
  }
  *scale = (float64)(1.0 / *ptr_00);
  **active_alpha = 1.0;
  **active_astate = 0;
  *n_active_astate = 1;
  *ptr_01 = 0;
  n_sum_active = 1;
  l_cb = 1;
  while( true ) {
    amap._4_4_ = 0;
    if (n_obs <= l_cb) goto LAB_00109e2d;
    if ((phseg != (s3phseg_t *)0x0) && (phseg->ef < l_cb)) {
      phseg = phseg->next;
    }
    local_80 = 0;
    pfVar12 = (float64 *)
              __ckd_calloc__((ulong)n_sum_active,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                             ,0x15d);
    active_alpha[l_cb] = pfVar12;
    if (bp != (uint32 **)0x0) {
      puVar13 = (uint32 *)
                __ckd_calloc__((ulong)n_sum_active,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                               ,0x15f);
      bp[l_cb] = puVar13;
      if ((uint)amap < n_sum_active) {
        local_120 = __ckd_realloc__(local_120,(ulong)n_sum_active << 3,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                    ,0x162);
      }
      memset(local_120,0,(ulong)n_sum_active << 3);
    }
    amap._0_4_ = n_sum_active;
    for (u = 0; u < n_sum_active; u = u + 1) {
      uVar4 = ptr_01[u];
      puVar13 = state_seq[uVar4].next_state;
      for (active_a._4_4_ = 0; active_a._4_4_ < state_seq[uVar4].n_next;
          active_a._4_4_ = active_a._4_4_ + 1) {
        uVar5 = puVar13[active_a._4_4_];
        if ((state_seq[uVar5].mixw != 0xffffffff) &&
           (*(short *)((long)ptr_03 + (ulong)uVar5 * 2) == -1)) {
          uVar6 = state_seq[uVar5].l_cb;
          if (*(uint32 *)((long)ptr + (ulong)uVar6 * 4) != l_cb) {
            if (timers != (bw_timers_t *)0x0) {
              ptmr_start(&timers->gau_timer);
            }
            if (uVar3 == 1) {
              local_150 = den_idx[uVar6];
            }
            else {
              local_150 = (uint32 **)0x0;
            }
            gauden_compute_log(den[uVar6],den_idx[uVar6],feature[l_cb],g_00,state_seq[uVar5].cb,
                               local_150);
            uVar15 = local_80 + 1;
            cb[local_80] = uVar6;
            *(uint32 *)((long)ptr + (ulong)uVar6 * 4) = l_cb;
            local_80 = uVar15;
            if (timers != (bw_timers_t *)0x0) {
              ptmr_stop(&timers->gau_timer);
            }
          }
          *(short *)((long)ptr_03 + (ulong)uVar5 * 2) = (short)amap._4_4_;
          active_alpha[l_cb][amap._4_4_] = 0.0;
          *(uint *)((long)ptr_02 + (ulong)amap._4_4_ * 4) = uVar5;
          amap._4_4_ = amap._4_4_ + 1;
          if (amap._4_4_ == (uint)amap) {
            amap._0_4_ = (uint)amap + 10;
            pfVar12 = (float64 *)
                      __ckd_realloc__(active_alpha[l_cb],(ulong)(uint)amap << 3,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                      ,0x1a4);
            active_alpha[l_cb] = pfVar12;
            if (bp != (uint32 **)0x0) {
              puVar14 = (uint32 *)
                        __ckd_realloc__(bp[l_cb],(ulong)(uint)amap << 2,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                        ,0x1a8);
              bp[l_cb] = puVar14;
              local_120 = __ckd_realloc__(local_120,(ulong)(uint)amap << 3,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                          ,0x1ab);
              memset(bp[l_cb] + ((ulong)(uint)amap - 10),0,0x28);
              memset((void *)((long)local_120 + (ulong)(uint)amap * 8 + -0x50),0,0x50);
            }
          }
        }
      }
    }
    pfVar12 = gauden_scale_densities_fwd(den,den_idx,cb,local_80,g_00);
    dscale[l_cb] = pfVar12;
    for (u = 0; u < n_sum_active; u = u + 1) {
      uVar4 = ptr_01[u];
      puVar13 = state_seq[uVar4].next_state;
      pfVar9 = state_seq[uVar4].next_tprob;
      dVar19 = (double)active_alpha[l_cb - 1][u];
      for (active_a._4_4_ = 0; active_a._4_4_ < state_seq[uVar4].n_next;
          active_a._4_4_ = active_a._4_4_ + 1) {
        uVar5 = puVar13[active_a._4_4_];
        if (state_seq[uVar5].mixw != 0xffffffff) {
          fVar17 = gauden_mixture(den[state_seq[uVar5].l_cb],den_idx[state_seq[uVar5].l_cb],
                                  pppfVar8[state_seq[uVar5].mixw],g_00);
          ptr_00[uVar5] = (double)fVar17;
          dVar18 = dVar19 * (double)(float)pfVar9[active_a._4_4_];
          if ((bp != (uint32 **)0x0) &&
             (pdVar1 = (double *)
                       ((long)local_120 + (ulong)*(ushort *)((long)ptr_03 + (ulong)uVar5 * 2) * 8),
             *pdVar1 <= dVar18 && dVar18 != *pdVar1)) {
            *(double *)((long)local_120 + (ulong)*(ushort *)((long)ptr_03 + (ulong)uVar5 * 2) * 8) =
                 dVar18;
            bp[l_cb][*(ushort *)((long)ptr_03 + (ulong)uVar5 * 2)] = u;
          }
          uVar2 = *(ushort *)((long)ptr_03 + (ulong)uVar5 * 2);
          active_alpha[l_cb][uVar2] =
               (float64)(dVar18 * ptr_00[uVar5] + (double)active_alpha[l_cb][uVar2]);
        }
      }
    }
    for (u = 0; u < amap._4_4_; u = u + 1) {
      uVar4 = *(uint *)((long)ptr_02 + (ulong)u * 4);
      puVar13 = state_seq[uVar4].next_state;
      pfVar9 = state_seq[uVar4].next_tprob;
      for (active_a._4_4_ = 0; active_a._4_4_ < state_seq[uVar4].n_next;
          active_a._4_4_ = active_a._4_4_ + 1) {
        uVar5 = puVar13[active_a._4_4_];
        if (state_seq[uVar5].mixw == 0xffffffff) {
          dVar19 = (double)active_alpha[l_cb][u] * (double)(float)pfVar9[active_a._4_4_];
          if (*(short *)((long)ptr_03 + (ulong)uVar5 * 2) == -1) {
            *(short *)((long)ptr_03 + (ulong)uVar5 * 2) = (short)amap._4_4_;
            active_alpha[l_cb][amap._4_4_] = 0.0;
            *(uint *)((long)ptr_02 + (ulong)amap._4_4_ * 4) = uVar5;
            amap._4_4_ = amap._4_4_ + 1;
            if (amap._4_4_ == (uint)amap) {
              amap._0_4_ = (uint)amap + 10;
              pfVar12 = (float64 *)
                        __ckd_realloc__(active_alpha[l_cb],(ulong)(uint)amap << 3,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                        ,0x21c);
              active_alpha[l_cb] = pfVar12;
              if (bp != (uint32 **)0x0) {
                puVar14 = (uint32 *)
                          __ckd_realloc__(bp[l_cb],(ulong)(uint)amap << 2,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                          ,0x21f);
                bp[l_cb] = puVar14;
                local_120 = __ckd_realloc__(local_120,(ulong)(uint)amap << 3,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                            ,0x221);
                memset(bp[l_cb] + ((ulong)(uint)amap - 10),0,0x28);
                memset((void *)((long)local_120 + (ulong)(uint)amap * 8 + -0x50),0,0x50);
              }
            }
            if (bp != (uint32 **)0x0) {
              bp[l_cb][*(ushort *)((long)ptr_03 + (ulong)uVar5 * 2)] = u;
              *(double *)((long)local_120 + (ulong)*(ushort *)((long)ptr_03 + (ulong)uVar5 * 2) * 8)
                   = dVar19;
            }
          }
          if ((bp != (uint32 **)0x0) &&
             (pdVar1 = (double *)
                       ((long)local_120 + (ulong)*(ushort *)((long)ptr_03 + (ulong)uVar5 * 2) * 8),
             *pdVar1 <= dVar19 && dVar19 != *pdVar1)) {
            bp[l_cb][*(ushort *)((long)ptr_03 + (ulong)uVar5 * 2)] = u;
            *(double *)((long)local_120 + (ulong)*(ushort *)((long)ptr_03 + (ulong)uVar5 * 2) * 8) =
                 dVar19;
          }
          uVar2 = *(ushort *)((long)ptr_03 + (ulong)uVar5 * 2);
          active_alpha[l_cb][uVar2] = (float64)(dVar19 + (double)active_alpha[l_cb][uVar2]);
        }
      }
    }
    now_den = (float64 ***)0x0;
    for (u = 0; u < amap._4_4_; u = u + 1) {
      if ((double)now_den < (double)active_alpha[l_cb][u]) {
        now_den = (float64 ***)active_alpha[l_cb][u];
      }
    }
    if ((((double)now_den == 0.0) && (!NAN((double)now_den))) && (amap._4_4_ != 0)) break;
    if ((double)now_den < 1e-300) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
              ,0x263,"Best alpha < 1e-300\n");
      acbframe._4_4_ = -1;
      goto LAB_00109e2d;
    }
    if (amap._4_4_ == 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
              ,0x26a,"No active states at time %u\n",(ulong)l_cb);
      acbframe._4_4_ = -1;
      goto LAB_00109e2d;
    }
    scale[l_cb] = (float64)(1.0 / (double)now_den);
    dVar19 = log10((double)now_den);
    dVar18 = log10((double)beam);
    if (dVar19 + dVar18 <= -300.0) {
      balpha = 1e-300;
    }
    else {
      balpha = (float64)((double)now_den * (double)beam);
    }
    bVar16 = false;
    if (phseg != (s3phseg_t *)0x0) {
      for (u = 0; u < amap._4_4_; u = u + 1) {
        aVar10 = acmod_set_base_phone
                           (acmod_set,state_seq[*(uint *)((long)ptr_02 + (ulong)u * 4)].phn);
        aVar11 = acmod_set_base_phone(acmod_set,phseg->phone);
        if (aVar10 == aVar11) break;
      }
      bVar16 = u != amap._4_4_;
    }
    puVar13 = (uint32 *)
              __ckd_calloc__((ulong)amap._4_4_,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                             ,0x293);
    active_astate[l_cb] = puVar13;
    n_sum_active = 0;
    for (u = 0; u < amap._4_4_; u = u + 1) {
      if ((bp != (uint32 **)0x0) &&
         (state_seq[*(uint *)((long)ptr_02 + (ulong)u * 4)].mixw == 0xffffffff)) {
        bp[l_cb][u] = *(uint32 *)((long)ptr_02 + (ulong)bp[l_cb][u] * 4);
      }
      if ((phseg == (s3phseg_t *)0x0) || (!bVar16)) {
        if ((double)active_alpha[l_cb][u] <= (double)balpha) {
          *(undefined2 *)((long)ptr_03 + (ulong)*(uint *)((long)ptr_02 + (ulong)u * 4) * 2) = 0xffff
          ;
        }
        else {
          active_alpha[l_cb][n_sum_active] =
               (float64)((double)active_alpha[l_cb][u] * (double)scale[l_cb]);
          uVar7 = *(uint32 *)((long)ptr_02 + (ulong)u * 4);
          active_astate[l_cb][n_sum_active] = uVar7;
          ptr_01[n_sum_active] = uVar7;
          if (bp != (uint32 **)0x0) {
            bp[l_cb][n_sum_active] = bp[l_cb][u];
          }
          *(short *)((long)ptr_03 + (ulong)*(uint *)((long)ptr_02 + (ulong)u * 4) * 2) =
               (short)n_sum_active;
          n_sum_active = n_sum_active + 1;
        }
      }
      else {
        aVar10 = acmod_set_base_phone
                           (acmod_set,state_seq[*(uint *)((long)ptr_02 + (ulong)u * 4)].phn);
        aVar11 = acmod_set_base_phone(acmod_set,phseg->phone);
        if (aVar10 == aVar11) {
          active_alpha[l_cb][n_sum_active] =
               (float64)((double)active_alpha[l_cb][u] * (double)scale[l_cb]);
          uVar7 = *(uint32 *)((long)ptr_02 + (ulong)u * 4);
          active_astate[l_cb][n_sum_active] = uVar7;
          ptr_01[n_sum_active] = uVar7;
          if (bp != (uint32 **)0x0) {
            bp[l_cb][n_sum_active] = bp[l_cb][u];
          }
          *(short *)((long)ptr_03 + (ulong)*(uint *)((long)ptr_02 + (ulong)u * 4) * 2) =
               (short)n_sum_active;
          n_sum_active = n_sum_active + 1;
        }
        else {
          *(undefined2 *)((long)ptr_03 + (ulong)*(uint *)((long)ptr_02 + (ulong)u * 4) * 2) = 0xffff
          ;
        }
      }
    }
    for (u = 0; u < n_sum_active; u = u + 1) {
      if ((bp != (uint32 **)0x0) && (state_seq[(uint)ptr_01[u]].mixw == 0xffffffff)) {
        bp[l_cb][u] = (uint)*(ushort *)((long)ptr_03 + (ulong)bp[l_cb][u] * 2);
      }
    }
    for (u = 0; u < n_sum_active; u = u + 1) {
      *(undefined2 *)((long)ptr_03 + (ulong)(uint)ptr_01[u] * 2) = 0xffff;
    }
    n_active_astate[l_cb] = n_sum_active;
    next_active._4_4_ = n_sum_active + next_active._4_4_;
    l_cb = l_cb + 1;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
          ,0x252,"All %u active states,",(ulong)amap._4_4_);
  for (u = 0; u < amap._4_4_; u = u + 1) {
    if (state_seq[*(uint *)((long)ptr_02 + (ulong)u * 4)].mixw == 0xffffffff) {
      fprintf(_stderr," N(%u,%u)",(ulong)state_seq[*(uint *)((long)ptr_02 + (ulong)u * 4)].tmat,
              (ulong)state_seq[*(uint *)((long)ptr_02 + (ulong)u * 4)].m_state);
    }
    else {
      fprintf(_stderr," %u",(ulong)state_seq[*(uint *)((long)ptr_02 + (ulong)u * 4)].mixw);
    }
  }
  fprintf(_stderr,", zero at time %u\n",(ulong)l_cb);
  fflush(_stderr);
  acbframe._4_4_ = -1;
LAB_00109e2d:
  if (mmi_train == 0) {
    printf(" %u ",(ulong)next_active._4_4_ / (ulong)n_obs,(ulong)next_active._4_4_ % (ulong)n_obs);
  }
  goto LAB_00109e4d;
}

Assistant:

int32
forward(float64 **active_alpha,
	uint32 **active_astate,
	uint32 *n_active_astate,
	uint32 **bp,
	float64 *scale,
	float64 **dscale,
	vector_t **feature,
	uint32 n_obs,
	state_t *state_seq,
	uint32 n_state,
	model_inventory_t *inv,
	float64 beam,
	s3phseg_t *phseg,
	bw_timers_t *timers,
	uint32 mmi_train)
{
    uint32 i, j, s, t, u;
    uint32 l_cb;
    uint32 *active_a;
    uint32 *active_b;
    uint32 *active;
    uint32 *active_l_cb;
    uint32 n_active;
    uint32 n_active_l_cb;
    uint32 n_sum_active;
    uint32 *next_active;
    uint32 n_next_active;
    uint32 aalpha_alloc;
    uint16 *amap;
    uint32 *next;
    float32 *tprob;
    float64 prior_alpha;
    float32 ***mixw;
    gauden_t *g;
    acmod_set_t *as;
    float64 x;
    float64 pthresh = 1e-300;
    float64 balpha;
    float64 ***now_den;
    uint32 ***now_den_idx;
    uint32 retval = S3_SUCCESS;
    uint32 n_l_cb;
    int32 *acbframe; /* Frame in which a codebook was last active */
    float64 *outprob;
    /* Can we prune this frame using phseg? */
    int can_prune_phseg;
    float64 *best_pred = NULL;
    
    /* # of distinct codebooks referenced by this utterance */
    n_l_cb = inv->n_cb_inverse;

    /* active codebook frame index */
    acbframe = ckd_calloc(n_l_cb, sizeof(*acbframe));

    g = inv->gauden;
    as = inv->mdef->acmod_set;
    /* density values and indices (for top-N eval) for some time t */
    now_den = (float64 ***)ckd_calloc_3d(n_l_cb, gauden_n_feat(g), gauden_n_top(g),
					 sizeof(float64));
    now_den_idx = (uint32 ***)ckd_calloc_3d(n_l_cb, gauden_n_feat(g), gauden_n_top(g),
					    sizeof(uint32));
    /* Mixing weight array */
    mixw = inv->mixw;

    /* Scratch area for output probabilities at some time t */
    outprob = (float64 *)ckd_calloc(n_state, sizeof(float64));

    /* Active state lists for time t and t+1 */
    active_a = ckd_calloc(n_state, sizeof(uint32));
    active_b = ckd_calloc(n_state, sizeof(uint32));

    /* Active (local) codebooks for some time t */
    active_l_cb = ckd_calloc(n_state, sizeof(uint32));

    /* Mapping from sentence HMM state index to active state list index
    * for currently active time. */
    amap = ckd_calloc(n_state, sizeof(uint16));
    
    /* set up the active and next_active lists and associated counts */
    active = active_a;
    next_active = active_b;
    n_active = 0;
    n_active_l_cb = 0;
    n_sum_active = 0;
    n_next_active = 0;

    /* Initialize the active state map such that all states are inactive */
    for (i = 0; i < n_state; i++)
	amap[i] = INACTIVE;

    /*
     * The following section computes the output liklihood of
     * the initial state for t == 0 and puts the initial state
     * in the active state list.
     */

    if (timers)
	ptmr_start(&timers->gau_timer);

    /* compute alpha for the initial state at t == 0 */
    /* Compute the component Gaussians for state 0 mixture density */
    gauden_compute_log(now_den[state_seq[0].l_cb],
		       now_den_idx[state_seq[0].l_cb],
		       feature[0],
		       g,
		       state_seq[0].cb, NULL);

    active_l_cb[0] = state_seq[0].l_cb;

    dscale[0] = gauden_scale_densities_fwd(now_den, now_den_idx,
					   active_l_cb, 1, g);

    /* Compute the mixture density value for state 0 time 0 */
    outprob[0] = gauden_mixture(now_den[state_seq[0].l_cb],
				now_den_idx[state_seq[0].l_cb],
				mixw[state_seq[0].mixw],
				g);
    if (timers)
	ptmr_stop(&timers->gau_timer);
    if (outprob[0] <= MIN_IEEE_NORM_POS_FLOAT32) {
	E_ERROR("Small output prob (== %.2e) seen at frame 0 state 0\n", outprob[0]);

	retval = S3_ERROR;
	
	goto cleanup;
    }

    /*
     * Allocate space for the initial state in the alpha
     * and active state arrays
     */
    active_alpha[0] = ckd_calloc(1, sizeof(float64));
    active_astate[0] = ckd_calloc(1, sizeof(uint32));
    if (bp)
	bp[0] = ckd_calloc(1, sizeof(uint32)); /* Unused, actually */
    aalpha_alloc = 1;

    /*
     * Allocate the bestscore array for embedded Viterbi
     */
    if (bp)
	best_pred = ckd_calloc(1, sizeof(float64));

    /* Compute scale for t == 0 */
    scale[0] = 1.0 / outprob[0];

    /* set the scaled alpha variable for the initial state */
    active_alpha[0][0] = 1.0;
    /* put the initial state in the active state array for t == 0 */
    active_astate[0][0] = 0;
    /* Only one initial state (for now) */
    n_active_astate[0] = 1;

    /* insert the initial state in the active list */
    active[n_active] = 0;
    n_active++;

    /* Compute scaled alpha over all remaining time in the utterance */
    for (t = 1; t < n_obs; t++) {
	/* Find active phone for this timepoint. */
	if (phseg) {
	    /* Move the pointer forward if necessary. */
	    if (t > phseg->ef)
		phseg = phseg->next;
	}
	n_active_l_cb = 0;

	/* assume next active state set about the same size as current;
	   adjust to actual size as necessary later */
	active_alpha[t] = (float64 *)ckd_calloc(n_active, sizeof(float64));
	if (bp) {
	    bp[t] = (uint32 *)ckd_calloc(n_active, sizeof(uint32));
	    /* reallocate the best score array and zero it out */
	    if (n_active > aalpha_alloc)
		best_pred = (float64 *)ckd_realloc(best_pred, n_active * sizeof(float64));
	    memset(best_pred, 0, n_active * sizeof(float64));
	}
	aalpha_alloc = n_active;

	/* For all active states at the previous frame, activate their
	   successors in this frame and compute codebooks. */
	/* (these are pre-computed so they can be scaled to avoid underflows) */
	for (s = 0; s < n_active; s++) {
	    i = active[s];
#if FORWARD_DEBUG
	    E_INFO("At time %d, In Gaussian computation, active state %d\n",t, i);
#endif
	    /* get list of states adjacent to active state i */
	    next = state_seq[i].next_state;	

	    /* activate them all, computing their codebook densities if necessary */
	    for (u = 0; u < state_seq[i].n_next; u++) {
		j = next[u];
#if FORWARD_DEBUG
		E_INFO("In Gaussian computation, active state %d, next state %d\n", i,j);
#endif
		if (state_seq[j].mixw != TYING_NON_EMITTING) {
		    if (amap[j] == INACTIVE) {
			l_cb = state_seq[j].l_cb;
			
			if (acbframe[l_cb] != t) {
			    /* Component density values not yet computed */
			    if (timers)
				ptmr_start(&timers->gau_timer);
			    gauden_compute_log(now_den[l_cb],
					       now_den_idx[l_cb],
					       feature[t],
					       g,
					       state_seq[j].cb,
					       /* Preinitializing topn
						  only really makes a
						  difference for
						  semi-continuous
						  (n_l_cb == 1)
						  models. */
					       n_l_cb == 1
					       ? now_den_idx[l_cb] : NULL);

			    active_l_cb[n_active_l_cb++] = l_cb;
			    acbframe[l_cb] = t;

			    if (timers)
				ptmr_stop(&timers->gau_timer);
			}

			/* Put next state j into the active list */
			amap[j] = n_next_active;

			/* Initialize the alpha variable to zero */
			active_alpha[t][n_next_active] = 0;

			/* Map active state list index to sentence HMM index */
			next_active[n_next_active] = j;

			++n_next_active;

			if (n_next_active == aalpha_alloc) {
			    /* Need to reallocate the active_alpha array */
			    aalpha_alloc += ACHK;
			    active_alpha[t] = ckd_realloc(active_alpha[t],
							  sizeof(float64) * aalpha_alloc);
			    /* And the backpointer array */
			    if (bp) {
				bp[t] = ckd_realloc(bp[t],
						    sizeof(uint32) * aalpha_alloc);
				/* And the best score array */
				best_pred = (float64 *)ckd_realloc(best_pred,
								   sizeof(float64) * aalpha_alloc);
				/* Make sure the new stuff is zero */
				memset(bp[t] + aalpha_alloc - ACHK,
				       0, sizeof(uint32) * ACHK);
				memset(best_pred + aalpha_alloc - ACHK,
				       0, sizeof(float64) * ACHK);
			    }
			}
		    }
		}
	    }
	}

	/* Cope w/ numerical issues by dividing densities by max density */
	dscale[t] = gauden_scale_densities_fwd(now_den, now_den_idx,
					       active_l_cb, n_active_l_cb, g);
	
	/* Now, for all active states in the previous frame, compute
	   alpha for all successors in this frame. */
	for (s = 0; s < n_active; s++) {
	    i = active[s];
	    
#if FORWARD_DEBUG
	    E_INFO("At time %d, In real state alpha update, active state %d\n",t, i);
#endif
	    /* get list of states adjacent to active state i */
	    next = state_seq[i].next_state;	
	    /* get the associated transition probs */
	    tprob = state_seq[i].next_tprob;

	    /* the scaled alpha value for i at t-1 */
	    prior_alpha = active_alpha[t-1][s];

	    /* For all emitting states j adjacent to i, update their
	     * alpha values.  */
	    for (u = 0; u < state_seq[i].n_next; u++) {
		j = next[u];
#if FORWARD_DEBUG
		E_INFO("In real state update, active state %d, next state %d\n", i,j);
#endif
		l_cb = state_seq[j].l_cb;

		if (state_seq[j].mixw != TYING_NON_EMITTING) {
		    /* Next state j is an emitting state */
		    outprob[j] = gauden_mixture(now_den[l_cb],
						now_den_idx[l_cb],
						mixw[state_seq[j].mixw],
						g);


		    /* update backpointers bp[t][j] */
		    x = prior_alpha * tprob[u];
		    if (bp) {
			if (x > best_pred[amap[j]]) {
#if FORWARD_DEBUG
			    E_INFO("In real state update, backpointer %d => %d updated from %e to (%e * %e = %e)\n",
				   i, j, best_pred[amap[j]], prior_alpha, tprob[u], x);
#endif
			    best_pred[amap[j]] = x;
			    bp[t][amap[j]] = s;
			}
		    }
		    
		    /* update the unscaled alpha[t][j] */
		    active_alpha[t][amap[j]] += x * outprob[j];
		}
		else {
		    /* already done below in the prior time frame */
		}
	    }
	}

#if FORWARD_DEBUG
	if (bp) {
	    for (s = 0; s < n_next_active; ++s) {
		j = next_active[s];
		E_INFO("After real state update, best path to %d(%d) = %d(%d)\n",
		       j, amap[j], active[bp[t][s]], bp[t][s]);
	    }
	}
#endif
	/* Now, for all active states in this frame, consume any
	   following non-emitting states (multiplying in their
	   transition probabilities)  */
	for (s = 0; s < n_next_active; s++) {
	    i = next_active[s];

	    /* find the successor states */
	    next = state_seq[i].next_state;
	    tprob = state_seq[i].next_tprob;

	    for (u = 0; u < state_seq[i].n_next; u++) {
		j = next[u];
		/* for any non-emitting ones */
		if (state_seq[j].mixw == TYING_NON_EMITTING) {
#if FORWARD_DEBUG
		    E_INFO("In non-emitting state update, active state %d, next state %d\n",i,j);
#endif
		    x = active_alpha[t][s] * tprob[u];

#if FORWARD_DEBUG
		    E_INFO("In non-emitting state update, active_alpha[t][s]: %f,tprob[u]:  %f\n",active_alpha[t][s],tprob[u]);
#endif
		    /* activate this state if necessary */
		    if (amap[j] == INACTIVE) {
			amap[j] = n_next_active;
			active_alpha[t][n_next_active] = 0;
			next_active[n_next_active] = j;
			++n_next_active;

			if (n_next_active == aalpha_alloc) {
			    aalpha_alloc += ACHK;
			    active_alpha[t] = ckd_realloc(active_alpha[t],
							  sizeof(float64) * aalpha_alloc);
			    if (bp) {
				bp[t] = ckd_realloc(bp[t],
						    sizeof(uint32) * aalpha_alloc);
				best_pred = (float64 *)ckd_realloc(best_pred,
								   sizeof(float64) * aalpha_alloc);
				memset(bp[t] + aalpha_alloc - ACHK,
				       0, sizeof(uint32) * ACHK);
				memset(best_pred + aalpha_alloc - ACHK,
				       0, sizeof(float64) * ACHK);
			    }
			}
			if (bp) {
			    /* Give its backpointer a default value */
			    bp[t][amap[j]] = s;
			    best_pred[amap[j]] = x;
			}
		    }

		    /* update backpointers bp[t][j] */
		    if (bp && x > best_pred[amap[j]]) {
			bp[t][amap[j]] = s;
			best_pred[amap[j]] = x;
		    }
		    /* update its alpha value */
		    active_alpha[t][amap[j]] += x;
		}
	    }
	}

#if FORWARD_DEBUG
	for (s = 0; s < n_next_active; ++s) {
	    j = next_active[s];
	    if (bp && state_seq[j].mixw == TYING_NON_EMITTING) {
		E_INFO("After non-emitting state update, best path to %d(%d) = %d(%d)\n",
		       j, amap[j], next_active[bp[t][s]], bp[t][s]);
		/* Assumptions about topology that might not be valid
		 * but are useful for debugging. */
		assert(next_active[bp[t][s]] <= j);
		assert(j - next_active[bp[t][s]] <= 2);
	    }
	}
#endif
	/* find best alpha value in current frame for pruning and scaling purposes */
	balpha = 0;
	/* also take the argmax to find the best backtrace */
	for (s = 0; s < n_next_active; s++) {
	    if (balpha < active_alpha[t][s]) {
		balpha = active_alpha[t][s];
	    }
	}

	/* cope with some pathological case */
	if (balpha == 0.0 && n_next_active > 0) {
	    E_ERROR("All %u active states,", n_next_active);
	    for (s = 0; s < n_next_active; s++) {
		if (state_seq[next_active[s]].mixw != TYING_NON_EMITTING)
		    fprintf(stderr, " %u", state_seq[next_active[s]].mixw);
		else
		    fprintf(stderr, " N(%u,%u)",
			    state_seq[next_active[s]].tmat, state_seq[next_active[s]].m_state);

	    }
	    fprintf(stderr, ", zero at time %u\n", t);
	    fflush(stderr);
	    retval =  S3_ERROR;
	    break;
	}

	/* and some related pathological cases */
	if (balpha < 1e-300) {
	    E_ERROR("Best alpha < 1e-300\n");

	    retval = S3_ERROR;

	    break;
	}
	if (n_next_active == 0) {
	    E_ERROR("No active states at time %u\n", t);
	    retval = S3_ERROR;
	    break;
	}

	/* compute the scale factor */
	scale[t] = 1.0 / balpha;
	/* compute the pruning threshold based on the beam */
	if (log10(balpha) + log10(beam) > -300) {
	    pthresh = balpha * beam;
	}
	else {
	    /* avoiding underflow... */
	    pthresh = 1e-300;
	}
/* DEBUG XXXXX */
/* pthresh = 0.0; */
/* END DEBUG */

	/* Determine if phone segmentation-based pruning would leave
	 * us with an empty active list (that would be bad!) */
	can_prune_phseg = 0;
	if (phseg) {
	    for (s = 0; s < n_next_active; ++s) 
		if (acmod_set_base_phone(as, state_seq[next_active[s]].phn)
		    == acmod_set_base_phone(as, phseg->phone))
		    break;
	    can_prune_phseg = !(s == n_next_active);
#if FORWARD_DEBUG
	    if (!can_prune_phseg) {
		E_INFO("Will not apply phone-based pruning at timepoint %d "
		       "(%d != %d) (%s != %s)\n", t,
		       state_seq[next_active[s]].phn,
		       phseg->phone,
		       acmod_set_id2name(inv->mdef->acmod_set, state_seq[next_active[s]].phn),
		       acmod_set_id2name(inv->mdef->acmod_set, phseg->phone)
		       );
	    }
#endif
	}
	/* Prune active states for the next frame and rescale their alphas. */
	active_astate[t] = ckd_calloc(n_next_active, sizeof(uint32));
	for (s = 0, n_active = 0; s < n_next_active; s++) {
	    /* "Snap" the backpointers for non-emitting states, so
	       that they don't point to bogus indices (we will use
	       amap to recover them). */
	    if (bp && state_seq[next_active[s]].mixw == TYING_NON_EMITTING) {
#if FORWARD_DEBUG
		E_INFO("Snapping backpointer for %d, %d => %d\n",
		       next_active[s], bp[t][s], next_active[bp[t][s]]);
#endif
		bp[t][s] = next_active[bp[t][s]];
	    }
	    /* If we have a phone segmentation, use it instead of the beam. */
	    if (phseg && can_prune_phseg) {
		if (acmod_set_base_phone(as, state_seq[next_active[s]].phn)
		    == acmod_set_base_phone(as, phseg->phone)) {
		    active_alpha[t][n_active] = active_alpha[t][s] * scale[t];
		    active[n_active] = active_astate[t][n_active] = next_active[s];
		    if (bp)
			bp[t][n_active] = bp[t][s];
		    amap[next_active[s]] = n_active;
		    n_active++;
		}
		else {
		    amap[next_active[s]] = INACTIVE;
		}
	    }
	    else {
		if (active_alpha[t][s] > pthresh) {
		    active_alpha[t][n_active] = active_alpha[t][s] * scale[t];
		    active[n_active] = active_astate[t][n_active] = next_active[s];
		    if (bp)
			bp[t][n_active] = bp[t][s];
		    amap[next_active[s]] = n_active;
		    n_active++;
		}
		else {
		    amap[next_active[s]] = INACTIVE;
		}
	    }
	}
	/* Now recover the backpointers for non-emitting states. */
	for (s = 0; s < n_active; ++s) {
	    if (bp && state_seq[active[s]].mixw == TYING_NON_EMITTING) {
#if FORWARD_DEBUG
		E_INFO("Snapping backpointer for %d, %d => %d(%d)\n",
		       active[s], bp[t][s], amap[bp[t][s]], active[amap[bp[t][s]]]);
#endif
		bp[t][s] = amap[bp[t][s]];
	    }
	}
	/* And finally deactive all states. */
	for (s = 0; s < n_active; ++s) {
	    amap[active[s]] = INACTIVE;
	}
	n_active_astate[t] = n_active;
	n_next_active = 0;

	n_sum_active += n_active;
    }
    if (!mmi_train)
	printf(" %u ", n_sum_active / n_obs);
    
cleanup:
    ckd_free(active_a);
    ckd_free(active_b);
    ckd_free(amap);

    ckd_free(active_l_cb);
    ckd_free(acbframe);

    ckd_free(outprob);
    ckd_free(best_pred);

    ckd_free_3d((void ***)now_den);
    ckd_free_3d((void ***)now_den_idx);

    return retval;
}